

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_code.hpp
# Opt level: O0

char * system_error2::detail::generic_code_message(errc code)

{
  char *pcStack_10;
  errc code_local;
  
  switch(code) {
  case success:
    pcStack_10 = "Success";
    break;
  case operation_not_permitted:
    pcStack_10 = "Operation not permitted";
    break;
  case no_such_file_or_directory:
    pcStack_10 = "No such file or directory";
    break;
  case no_such_process:
    pcStack_10 = "No such process";
    break;
  case interrupted:
    pcStack_10 = "Interrupted system call";
    break;
  case io_error:
    pcStack_10 = "Input/output error";
    break;
  case no_such_device_or_address:
    pcStack_10 = "No such device or address";
    break;
  case argument_list_too_long:
    pcStack_10 = "Argument list too long";
    break;
  case executable_format_error:
    pcStack_10 = "Exec format error";
    break;
  case bad_file_descriptor:
    pcStack_10 = "Bad file descriptor";
    break;
  case no_child_process:
    pcStack_10 = "No child processes";
    break;
  case operation_would_block:
    pcStack_10 = "Resource temporarily unavailable";
    break;
  case not_enough_memory:
    pcStack_10 = "Cannot allocate memory";
    break;
  case permission_denied:
    pcStack_10 = "Permission denied";
    break;
  case bad_address:
    pcStack_10 = "Bad address";
    break;
  default:
    pcStack_10 = "unknown";
    break;
  case device_or_resource_busy:
    pcStack_10 = "Device or resource busy";
    break;
  case file_exists:
    pcStack_10 = "File exists";
    break;
  case cross_device_link:
    pcStack_10 = "Invalid cross-device link";
    break;
  case no_such_device:
    pcStack_10 = "No such device";
    break;
  case not_a_directory:
    pcStack_10 = "Not a directory";
    break;
  case is_a_directory:
    pcStack_10 = "Is a directory";
    break;
  case invalid_argument:
    pcStack_10 = "Invalid argument";
    break;
  case too_many_files_open_in_system:
    pcStack_10 = "Too many open files in system";
    break;
  case too_many_files_open:
    pcStack_10 = "Too many open files";
    break;
  case inappropriate_io_control_operation:
    pcStack_10 = "Inappropriate ioctl for device";
    break;
  case text_file_busy:
    pcStack_10 = "Text file busy";
    break;
  case file_too_large:
    pcStack_10 = "File too large";
    break;
  case no_space_on_device:
    pcStack_10 = "No space left on device";
    break;
  case invalid_seek:
    pcStack_10 = "Illegal seek";
    break;
  case read_only_file_system:
    pcStack_10 = "Read-only file system";
    break;
  case too_many_links:
    pcStack_10 = "Too many links";
    break;
  case broken_pipe:
    pcStack_10 = "Broken pipe";
    break;
  case argument_out_of_domain:
    pcStack_10 = "Numerical argument out of domain";
    break;
  case result_out_of_range:
    pcStack_10 = "Numerical result out of range";
    break;
  case resource_deadlock_would_occur:
    pcStack_10 = "Resource deadlock avoided";
    break;
  case filename_too_long:
    pcStack_10 = "File name too long";
    break;
  case no_lock_available:
    pcStack_10 = "No locks available";
    break;
  case function_not_supported:
    pcStack_10 = "Function not implemented";
    break;
  case directory_not_empty:
    pcStack_10 = "Directory not empty";
    break;
  case too_many_symbolic_link_levels:
    pcStack_10 = "Too many levels of symbolic links";
    break;
  case no_message:
    pcStack_10 = "No message of desired type";
    break;
  case identifier_removed:
    pcStack_10 = "Identifier removed";
    break;
  case not_a_stream:
    pcStack_10 = "Device not a stream";
    break;
  case stream_timeout:
    pcStack_10 = "Timer expired";
    break;
  case no_stream_resources:
    pcStack_10 = "Out of streams resources";
    break;
  case no_link:
    pcStack_10 = "Link has been severed";
    break;
  case protocol_error:
    pcStack_10 = "Protocol error";
    break;
  case bad_message:
    pcStack_10 = "Bad message";
    break;
  case value_too_large:
    pcStack_10 = "Value too large for defined data type";
    break;
  case illegal_byte_sequence:
    pcStack_10 = "Invalid or incomplete multibyte or wide character";
    break;
  case not_a_socket:
    pcStack_10 = "Socket operation on non-socket";
    break;
  case destination_address_required:
    pcStack_10 = "Destination address required";
    break;
  case message_size:
    pcStack_10 = "Message too long";
    break;
  case wrong_protocol_type:
    pcStack_10 = "Protocol wrong type for socket";
    break;
  case no_protocol_option:
    pcStack_10 = "Protocol not available";
    break;
  case protocol_not_supported:
    pcStack_10 = "Protocol not supported";
    break;
  case not_supported:
    pcStack_10 = "Operation not supported";
    break;
  case address_family_not_supported:
    pcStack_10 = "Address family not supported by protocol";
    break;
  case address_in_use:
    pcStack_10 = "Address already in use";
    break;
  case address_not_available:
    pcStack_10 = "Cannot assign requested address";
    break;
  case network_down:
    pcStack_10 = "Network is down";
    break;
  case network_unreachable:
    pcStack_10 = "Network is unreachable";
    break;
  case network_reset:
    pcStack_10 = "Network dropped connection on reset";
    break;
  case connection_aborted:
    pcStack_10 = "Software caused connection abort";
    break;
  case connection_reset:
    pcStack_10 = "Connection reset by peer";
    break;
  case no_buffer_space:
    pcStack_10 = "No buffer space available";
    break;
  case already_connected:
    pcStack_10 = "Transport endpoint is already connected";
    break;
  case not_connected:
    pcStack_10 = "Transport endpoint is not connected";
    break;
  case timed_out:
    pcStack_10 = "Connection timed out";
    break;
  case connection_refused:
    pcStack_10 = "Connection refused";
    break;
  case host_unreachable:
    pcStack_10 = "No route to host";
    break;
  case connection_already_in_progress:
    pcStack_10 = "Operation already in progress";
    break;
  case operation_in_progress:
    pcStack_10 = "Operation now in progress";
    break;
  case operation_canceled:
    pcStack_10 = "Operation canceled";
    break;
  case owner_dead:
    pcStack_10 = "Owner died";
    break;
  case state_not_recoverable:
    pcStack_10 = "State not recoverable";
  }
  return pcStack_10;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR14 inline const char *generic_code_message(errc code) noexcept
  {
    switch(code)
    {
    case errc::success:
      return "Success";
    case errc::address_family_not_supported:
      return "Address family not supported by protocol";
    case errc::address_in_use:
      return "Address already in use";
    case errc::address_not_available:
      return "Cannot assign requested address";
    case errc::already_connected:
      return "Transport endpoint is already connected";
    case errc::argument_list_too_long:
      return "Argument list too long";
    case errc::argument_out_of_domain:
      return "Numerical argument out of domain";
    case errc::bad_address:
      return "Bad address";
    case errc::bad_file_descriptor:
      return "Bad file descriptor";
    case errc::bad_message:
      return "Bad message";
    case errc::broken_pipe:
      return "Broken pipe";
    case errc::connection_aborted:
      return "Software caused connection abort";
    case errc::connection_already_in_progress:
      return "Operation already in progress";
    case errc::connection_refused:
      return "Connection refused";
    case errc::connection_reset:
      return "Connection reset by peer";
    case errc::cross_device_link:
      return "Invalid cross-device link";
    case errc::destination_address_required:
      return "Destination address required";
    case errc::device_or_resource_busy:
      return "Device or resource busy";
    case errc::directory_not_empty:
      return "Directory not empty";
    case errc::executable_format_error:
      return "Exec format error";
    case errc::file_exists:
      return "File exists";
    case errc::file_too_large:
      return "File too large";
    case errc::filename_too_long:
      return "File name too long";
    case errc::function_not_supported:
      return "Function not implemented";
    case errc::host_unreachable:
      return "No route to host";
    case errc::identifier_removed:
      return "Identifier removed";
    case errc::illegal_byte_sequence:
      return "Invalid or incomplete multibyte or wide character";
    case errc::inappropriate_io_control_operation:
      return "Inappropriate ioctl for device";
    case errc::interrupted:
      return "Interrupted system call";
    case errc::invalid_argument:
      return "Invalid argument";
    case errc::invalid_seek:
      return "Illegal seek";
    case errc::io_error:
      return "Input/output error";
    case errc::is_a_directory:
      return "Is a directory";
    case errc::message_size:
      return "Message too long";
    case errc::network_down:
      return "Network is down";
    case errc::network_reset:
      return "Network dropped connection on reset";
    case errc::network_unreachable:
      return "Network is unreachable";
    case errc::no_buffer_space:
      return "No buffer space available";
    case errc::no_child_process:
      return "No child processes";
    case errc::no_link:
      return "Link has been severed";
    case errc::no_lock_available:
      return "No locks available";
    case errc::no_message:
      return "No message of desired type";
    case errc::no_protocol_option:
      return "Protocol not available";
    case errc::no_space_on_device:
      return "No space left on device";
    case errc::no_stream_resources:
      return "Out of streams resources";
    case errc::no_such_device_or_address:
      return "No such device or address";
    case errc::no_such_device:
      return "No such device";
    case errc::no_such_file_or_directory:
      return "No such file or directory";
    case errc::no_such_process:
      return "No such process";
    case errc::not_a_directory:
      return "Not a directory";
    case errc::not_a_socket:
      return "Socket operation on non-socket";
    case errc::not_a_stream:
      return "Device not a stream";
    case errc::not_connected:
      return "Transport endpoint is not connected";
    case errc::not_enough_memory:
      return "Cannot allocate memory";
#if ENOTSUP != EOPNOTSUPP
    case errc::not_supported:
      return "Operation not supported";
#endif
    case errc::operation_canceled:
      return "Operation canceled";
    case errc::operation_in_progress:
      return "Operation now in progress";
    case errc::operation_not_permitted:
      return "Operation not permitted";
    case errc::operation_not_supported:
      return "Operation not supported";
#if EAGAIN != EWOULDBLOCK
    case errc::operation_would_block:
      return "Resource temporarily unavailable";
#endif
    case errc::owner_dead:
      return "Owner died";
    case errc::permission_denied:
      return "Permission denied";
    case errc::protocol_error:
      return "Protocol error";
    case errc::protocol_not_supported:
      return "Protocol not supported";
    case errc::read_only_file_system:
      return "Read-only file system";
    case errc::resource_deadlock_would_occur:
      return "Resource deadlock avoided";
    case errc::resource_unavailable_try_again:
      return "Resource temporarily unavailable";
    case errc::result_out_of_range:
      return "Numerical result out of range";
    case errc::state_not_recoverable:
      return "State not recoverable";
    case errc::stream_timeout:
      return "Timer expired";
    case errc::text_file_busy:
      return "Text file busy";
    case errc::timed_out:
      return "Connection timed out";
    case errc::too_many_files_open_in_system:
      return "Too many open files in system";
    case errc::too_many_files_open:
      return "Too many open files";
    case errc::too_many_links:
      return "Too many links";
    case errc::too_many_symbolic_link_levels:
      return "Too many levels of symbolic links";
    case errc::value_too_large:
      return "Value too large for defined data type";
    case errc::wrong_protocol_type:
      return "Protocol wrong type for socket";
    default:
      return "unknown";
    }
  }